

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::get_projections2d
          (CImg<unsigned_char> *__return_storage_ptr__,CImg<unsigned_char> *this,uint x0,uint y0,
          uint z0)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  CImg<unsigned_char> *pCVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte value;
  CImg<unsigned_char> img_xz;
  CImg<unsigned_char> local_90;
  CImg<unsigned_char> img_xy;
  CImg<unsigned_char> img_zy;
  
  uVar1 = this->_width;
  uVar2 = this->_height;
  uVar3 = this->_depth;
  if (((uVar3 == 0 || uVar2 == 0) || (uVar1 == 0 || this->_data == (uchar *)0x0)) ||
     (uVar3 < 2 || this->_spectrum == 0)) {
    CImg(__return_storage_ptr__,this,false);
  }
  else {
    if (uVar1 <= x0) {
      x0 = uVar1 - 1;
    }
    if (uVar2 <= y0) {
      y0 = uVar2 - 1;
    }
    uVar4 = uVar3 - 1;
    if (z0 < uVar3) {
      uVar4 = z0;
    }
    get_crop(&img_xy,this,0,0,uVar4,0,uVar1 - 1,uVar2 - 1,uVar4,this->_spectrum - 1,false);
    get_crop(&img_xz,this,x0,0,0,0,x0,this->_height - 1,this->_depth - 1,this->_spectrum - 1,false);
    pCVar5 = permute_axes(&img_xz,"xzyc");
    pCVar5 = resize(pCVar5,this->_depth,this->_height,1,-100,-1,0,0.0,0.0,0.0,0.0);
    CImg(&img_zy,pCVar5);
    if ((img_xz._is_shared == false) && (img_xz._data != (uchar *)0x0)) {
      operator_delete__(img_xz._data);
    }
    get_crop(&local_90,this,0,y0,0,0,this->_width - 1,y0,this->_depth - 1,this->_spectrum - 1,false)
    ;
    pCVar5 = resize(&local_90,this->_width,this->_depth,1,-100,-1,0,0.0,0.0,0.0,0.0);
    CImg(&img_xz,pCVar5);
    if ((local_90._is_shared == false) && (local_90._data != (uchar *)0x0)) {
      operator_delete__(local_90._data);
    }
    uVar1 = this->_depth;
    uVar2 = this->_spectrum;
    uVar3 = this->_width;
    uVar4 = this->_height;
    pbVar6 = min(&img_xy);
    pbVar7 = min(&img_zy);
    pbVar8 = min(&img_xz);
    value = *pbVar7;
    if (*pbVar6 < *pbVar7) {
      value = *pbVar6;
    }
    if (*pbVar8 <= value) {
      value = *pbVar8;
    }
    CImg(&local_90,uVar3 + uVar1,uVar1 + uVar4,1,uVar2,value);
    pCVar5 = draw_image(&local_90,0,0,0,0,&img_xy,1.0);
    pCVar5 = draw_image(pCVar5,img_xy._width,0,0,0,&img_zy,1.0);
    pCVar5 = draw_image(pCVar5,0,img_xy._height,0,0,&img_xz,1.0);
    CImg(__return_storage_ptr__,pCVar5);
    if ((local_90._is_shared == false) && (local_90._data != (uchar *)0x0)) {
      operator_delete__(local_90._data);
    }
    if ((img_xz._is_shared == false) && (img_xz._data != (uchar *)0x0)) {
      operator_delete__(img_xz._data);
    }
    if ((img_zy._is_shared == false) && (img_zy._data != (uchar *)0x0)) {
      operator_delete__(img_zy._data);
    }
    if ((img_xy._is_shared == false) && (img_xy._data != (uchar *)0x0)) {
      operator_delete__(img_xy._data);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<T> get_projections2d(const unsigned int x0, const unsigned int y0, const unsigned int z0) const {
      if (is_empty() || _depth<2) return +*this;
      const unsigned int
        _x0 = (x0>=_width)?_width - 1:x0,
        _y0 = (y0>=_height)?_height - 1:y0,
        _z0 = (z0>=_depth)?_depth - 1:z0;
      const CImg<T>
        img_xy = get_crop(0,0,_z0,0,_width-1,_height-1,_z0,_spectrum-1),
        img_zy = get_crop(_x0,0,0,0,_x0,_height-1,_depth-1,_spectrum-1).permute_axes("xzyc").resize(_depth,_height,1,-100,-1),
        img_xz = get_crop(0,_y0,0,0,_width-1,_y0,_depth-1,_spectrum-1).resize(_width,_depth,1,-100,-1);
      return CImg<T>(_width + _depth,_height + _depth,1,_spectrum,cimg::min(img_xy.min(),img_zy.min(),img_xz.min())).
        draw_image(0,0,img_xy).draw_image(img_xy._width,0,img_zy).
        draw_image(0,img_xy._height,img_xz);
    }